

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O0

void __thiscall Zippy::ZipArchive::Save(ZipArchive *this,string *filename)

{
  bool bVar1;
  mz_bool mVar2;
  undefined8 uVar3;
  allocator<char> *__a;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ZipArchive *in_RDI;
  mz_zip_error errordata;
  ZipEntry *file;
  iterator __end2;
  iterator __begin2;
  vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *__range2;
  mz_zip_archive tempArchive;
  string tempPath;
  mz_uint in_stack_0000038c;
  mz_zip_archive *in_stack_00000390;
  mz_zip_archive *in_stack_00000398;
  string *in_stack_00000818;
  ZipArchive *in_stack_00000820;
  int in_stack_0000250c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  ZipArchive *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  size_type in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  ZipEntry *in_stack_fffffffffffffda8;
  mz_zip_archive *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  byte in_stack_fffffffffffffdc7;
  undefined4 in_stack_fffffffffffffdf8;
  mz_bool in_stack_fffffffffffffdfc;
  mz_zip_archive *in_stack_fffffffffffffe00;
  mz_uint flags;
  uint32_t in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  mz_zip_error local_1a8;
  char local_1a1 [71];
  undefined1 local_15a;
  ZipEntry *local_138;
  ZipEntry *local_130;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  local_128;
  mz_zip_archive *pZip;
  
  bVar1 = IsOpen(in_RDI);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
    ZipLogicError::ZipLogicError
              ((ZipLogicError *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    __cxa_throw(uVar3,&ZipLogicError::typeinfo,ZipLogicError::~ZipLogicError);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1712a7);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
            (in_stack_fffffffffffffd98,(char)(in_stack_fffffffffffffd90 >> 0x38),
             in_stack_fffffffffffffd88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  Impl::GenerateRandomName_abi_cxx11_(in_stack_0000250c);
  std::operator+(in_stack_fffffffffffffdb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x171375);
  mz_zip_writer_init_file
            ((mz_zip_archive *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,0x171389)
  ;
  pZip = (mz_zip_archive *)&in_RDI->m_ZipEntries;
  local_128._M_current =
       (ZipEntry *)
       std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::begin
                 ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                  in_stack_fffffffffffffd78);
  local_130 = (ZipEntry *)
              std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::end
                        ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
                         in_stack_fffffffffffffd78);
  do {
    bVar1 = __gnu_cxx::
            operator==<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                      ((__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                        *)in_stack_fffffffffffffd80,
                       (__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                        *)in_stack_fffffffffffffd78);
    flags = (mz_uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      mz_zip_writer_finalize_archive(pZip);
      mz_zip_writer_end((mz_zip_archive *)0x1717e7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1717f6);
      mVar2 = mz_zip_validate_file_archive
                        ((char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),flags
                         ,(mz_zip_error *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (mVar2 != 0) {
        Close(in_stack_fffffffffffffd80);
        pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17191f
                      );
        remove(pcVar4);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x171934);
        pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x171946
                      );
        rename((char *)this_00,pcVar4);
        Open(in_stack_00000820,in_stack_00000818);
        std::__cxx11::string::~string(this_00);
        return;
      }
      uVar3 = __cxa_allocate_exception(0x10);
      mz_zip_get_error_string(local_1a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0);
      ZipRuntimeError::ZipRuntimeError
                ((ZipRuntimeError *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      __cxa_throw(uVar3,&ZipRuntimeError::typeinfo,ZipRuntimeError::~ZipRuntimeError);
    }
    local_138 = __gnu_cxx::
                __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
                ::operator*(&local_128);
    bVar1 = Impl::ZipEntry::IsDirectory(local_138);
    if (!bVar1) {
      bVar1 = Impl::ZipEntry::IsModified(local_138);
      in_stack_fffffffffffffe0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe0c);
      if (bVar1) {
        Impl::ZipEntry::GetName_abi_cxx11_(in_stack_fffffffffffffda8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17161b);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x171634);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_138->m_EntryData);
        mVar2 = mz_zip_writer_add_mem
                          (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                           (void *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           (size_t)in_stack_fffffffffffffd98,
                           (mz_uint)(in_stack_fffffffffffffd90 >> 0x20));
        in_stack_fffffffffffffdc7 = mVar2 != 0 ^ 0xff;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd80);
        if ((in_stack_fffffffffffffdc7 & 1) != 0) {
          uVar3 = __cxa_allocate_exception(0x10);
          __a = (allocator<char> *)mz_zip_get_error_string((in_RDI->m_Archive).m_last_error);
          pcVar4 = local_1a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),pcVar4,__a);
          ZipRuntimeError::ZipRuntimeError
                    ((ZipRuntimeError *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          __cxa_throw(uVar3,&ZipRuntimeError::typeinfo,ZipRuntimeError::~ZipRuntimeError);
        }
      }
      else {
        in_stack_fffffffffffffe00 = &in_RDI->m_Archive;
        in_stack_fffffffffffffe08 = Impl::ZipEntry::Index(local_138);
        in_stack_fffffffffffffdfc =
             mz_zip_writer_add_from_zip_reader
                       (in_stack_00000398,in_stack_00000390,in_stack_0000038c);
        if (in_stack_fffffffffffffdfc == 0) {
          local_15a = 1;
          uVar3 = __cxa_allocate_exception(0x10);
          mz_zip_get_error_string((in_RDI->m_Archive).m_last_error);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                     (char *)in_stack_fffffffffffffdb8,(allocator<char> *)in_stack_fffffffffffffdb0)
          ;
          ZipRuntimeError::ZipRuntimeError
                    ((ZipRuntimeError *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          local_15a = 0;
          __cxa_throw(uVar3,&ZipRuntimeError::typeinfo,ZipRuntimeError::~ZipRuntimeError);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
    ::operator++(&local_128);
  } while( true );
}

Assistant:

void Save(std::string filename = "") {

            if (!IsOpen()) throw ZipLogicError("Cannot call Save on empty ZipArchive object!");

            if (filename.empty())
                filename = m_ArchivePath;

            // ===== Generate a random file name with the same path as the current file
            std::string tempPath = filename.substr(0, filename.rfind('/') + 1) + Impl::GenerateRandomName(20);

            // ===== Prepare an temporary archive file with the random filename;
            mz_zip_archive tempArchive = mz_zip_archive();
            mz_zip_writer_init_file(&tempArchive, tempPath.c_str(), 0);

            // ===== Iterate through the ZipEntries and add entries to the temporary file
            for (auto& file : m_ZipEntries) {
                if (file.IsDirectory()) continue; //TODO: Ensure this is the right thing to do (Excel issue)
                if (!file.IsModified()) {
                    if (!mz_zip_writer_add_from_zip_reader(&tempArchive, &m_Archive, file.Index()))
                        throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));
                }

                else {
                    if (!mz_zip_writer_add_mem(&tempArchive,
                                               file.GetName().c_str(),
                                               file.m_EntryData.data(),
                                               file.m_EntryData.size(),
                                               MZ_DEFAULT_COMPRESSION))
                        throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));
                }

            }

            // ===== Finalize and close the temporary archive
            mz_zip_writer_finalize_archive(&tempArchive);
            mz_zip_writer_end(&tempArchive);

            // ===== Validate the temporary file
            mz_zip_error errordata;
            if (!mz_zip_validate_file_archive(tempPath.c_str(), 0, &errordata))
                throw ZipRuntimeError(mz_zip_get_error_string(errordata));

            // ===== Close the current archive, delete the file with input filename (if it exists), rename the temporary and call Open.
            Close();
            std::remove(filename.c_str());
            std::rename(tempPath.c_str(), filename.c_str());
            Open(filename);

        }